

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_qp.c
# Opt level: O2

char * cmime_qp_decode(char *line_in,int mode,char esc_char)

{
  char cVar1;
  size_t sVar2;
  char *pcVar3;
  char cVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  
  sVar2 = strlen(line_in);
  pcVar3 = (char *)malloc(sVar2 + 1);
  iVar12 = 0;
  iVar5 = 0;
  do {
    iVar11 = (int)sVar2;
    if (iVar11 <= iVar5) {
LAB_0010a78f:
      pcVar3[iVar12] = '\0';
      return pcVar3;
    }
    lVar7 = (long)iVar5;
    cVar1 = line_in[lVar7];
    if (cVar1 == esc_char) {
      lVar10 = (long)iVar5;
      iVar9 = (int)(lVar10 + 2);
      lVar6 = lVar7;
      if (iVar11 <= iVar9) {
        pcVar3[iVar12] = '\0';
        goto LAB_0010a78f;
      }
      for (; (line_in[lVar6 + 1] == ' ' || (line_in[lVar6 + 1] == '\t')); lVar6 = lVar6 + 1) {
      }
      iVar8 = (int)lVar6 + 1;
      if ((line_in[iVar8] != '\r') && (line_in[iVar8] != '\n')) {
        if (("\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14"
             [line_in[lVar7 + 1]] == '\x14') ||
           ("\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14"
            [line_in[lVar10 + 2]] == '\x14')) {
          puts("invalid character for quoted-printable detected");
          cVar4 = esc_char;
        }
        else {
          iVar5 = iVar9;
          cVar4 = "\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14"
                  [line_in[lVar10 + 2]] +
                  "\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14\x14"
                  [line_in[lVar7 + 1]] * '\x10';
        }
        goto LAB_0010a6e9;
      }
      iVar5 = (int)lVar6 + 2;
      if ((iVar5 < iVar11) && ((line_in[iVar5] == '\n' || (line_in[iVar5] == '\r')))) {
        iVar8 = iVar5;
      }
    }
    else {
      cVar4 = cVar1;
      if (cVar1 == '_') {
        cVar4 = ' ';
      }
      if (mode != 1) {
        cVar4 = cVar1;
      }
LAB_0010a6e9:
      pcVar3[iVar12] = cVar4;
      iVar12 = iVar12 + 1;
      iVar8 = iVar5;
    }
    iVar5 = iVar8 + 1;
  } while( true );
}

Assistant:

char *cmime_qp_decode(char *line_in, int mode, char esc_char)  {

    char *line_out = NULL;
    char c;                                                     /* output character */
    int opos = 0;                                               /* output positioning */
    int ipos;                                                   /* input positioning */
    int len = strlen(line_in);                                  /* length of inputstring */

    /* we malloc size of line_in char as through decoding string just can get shorter, not longer */
    line_out = malloc(strlen(line_in)+1*sizeof(char));

    /* we now go through every character of the string */                           
    for(ipos = 0; ipos < len; ipos++) {
        c = line_in[ipos];
   
        /* start cracking if we reach the esc char */
        if (c == esc_char) {
            /* check if there are to other chars */
            if((ipos+2)<len) {
                /* remember position */
                int orig_pos = ipos;
                
                /* absorb whitespaces */
                if (1) {
                    char *w = &(line_in[ipos +1]);
                    while ((*w == '\t') || (*w == ' ')) {w++;ipos++;}
                }

                /* check for linebreak */   
                if (( line_in[ipos +1] == '\n') || (line_in[ipos +1] == '\r' )) {
                    ipos++;
                    if ((ipos+1 < len) && (( line_in[ipos +1] == '\n') || (line_in[ipos +1] == '\r' ))) {
                        ipos++;
                    }
                    continue;
                } else {
                    /* go back to origin pos */
                    ipos = orig_pos;
                    /* convert char from hex to dec */
                    if(ipos < len - 1) {
                        if(hexconv[(int)line_in[ipos+1]] == 20 || hexconv[(int)line_in[ipos+2]] == 20) {
                            printf("invalid character for quoted-printable detected\n");
                        } else {
                            /* convert an skip 2 chars */
                            c = (char)hexconv[(int)line_in[ipos+1]]*16 + hexconv[(int)line_in[ipos+2]];
                            ipos+=2;
                        }
                    } else {
                        printf("no chars left!");
                    }
                }
            } else {
                    line_out[opos] = '\0';
                /* if we're out of chars, quit */
                break;
            }
        } else if (( c == '_') && (mode == DECODE_QP_MODE_ISO)) {
            /* RFC2047 says: if you encounter a '_' charactier in the ISO encoding then this must be converted to a space */
          c = ' ';
        }
        /* put in the new character, converted or not */
        line_out[opos] = c;
        opos++;
    }
    /* terminate string */
    line_out[opos]='\0';

    return line_out;
}